

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketInitiator.cpp
# Opt level: O0

void __thiscall FIX::SocketInitiator::onStart(SocketInitiator *this)

{
  bool bVar1;
  time_t tVar2;
  socklen_t in_ECX;
  sockaddr *in_RDX;
  int in_ESI;
  time_t local_20;
  time_t now;
  time_t start;
  SocketInitiator *this_local;
  
  start = (time_t)this;
  Initiator::connect(&this->super_Initiator,in_ESI,in_RDX,in_ECX);
  while (bVar1 = Initiator::isStopped(&this->super_Initiator), ((bVar1 ^ 0xffU) & 1) != 0) {
    SocketConnector::block(&this->m_connector,&this->super_Strategy,false,1.0);
    (*(this->super_Initiator)._vptr_Initiator[0xd])(this,&this->m_connector);
  }
  now = 0;
  local_20 = 0;
  time(&now);
  do {
    bVar1 = Initiator::isLoggedOn(&this->super_Initiator);
    if (!bVar1) {
      return;
    }
    SocketConnector::block(&this->m_connector,&this->super_Strategy,false,0.0);
    tVar2 = time(&local_20);
  } while (tVar2 + -5 < now);
  return;
}

Assistant:

void SocketInitiator::onStart() {
  connect();

  while (!isStopped()) {
    m_connector.block(*this, false, 1.0);
    onTimeout(m_connector);
  }

  time_t start = 0;
  time_t now = 0;

  ::time(&start);
  while (isLoggedOn()) {
    m_connector.block(*this);
    if (::time(&now) - 5 >= start) {
      break;
    }
  }
}